

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_polygon_mesh.cpp
# Opt level: O1

void __thiscall
geometrycentral::surface::SimplePolygonMesh::readMeshFromAsciiStlFile
          (SimplePolygonMesh *this,istream *in)

{
  pointer *ppVVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator __position;
  unsigned_long uVar3;
  unsigned_long uVar4;
  pointer pVVar5;
  unsigned_long uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  unsigned_long *puVar13;
  bool bVar14;
  __type _Var15;
  istream *piVar16;
  unsigned_long *puVar17;
  unsigned_long *puVar18;
  string *prefix;
  string *prefix_00;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double x;
  vector<unsigned_long,_std::allocator<unsigned_long>_> face;
  double z;
  anon_class_24_3_19152d57 assertToken;
  string line;
  double z_1;
  double y_1;
  anon_class_32_4_26ba02a2 nextLine;
  size_t lineNum;
  stringstream ss;
  string local_2c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_290;
  anon_class_24_3_19152d57 local_288;
  unsigned_long *local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  vector<geometrycentral::Vector3,std::allocator<geometrycentral::Vector3>> *local_258;
  string local_250;
  string local_230;
  double local_210;
  double local_208;
  string local_200;
  anon_class_32_4_26ba02a2 local_1e0;
  size_t local_1c0;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  clear(this);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  local_230._M_string_length = 0;
  local_230.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_288.lineNum = &local_1c0;
  local_1c0 = 1;
  local_288.line = &local_230;
  local_288.ss = (stringstream *)local_1b8;
  local_1e0.in = in;
  local_1e0.line = local_288.line;
  local_1e0.ss = (stringstream *)local_1b8;
  local_1e0.lineNum = local_288.lineNum;
  readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()(&local_1e0);
  paVar2 = &local_2c8.field_2;
  local_258 = (vector<geometrycentral::Vector3,std::allocator<geometrycentral::Vector3>> *)
              &this->vertexCoordinates;
  while( true ) {
    bVar14 = readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()(&local_1e0);
    if (bVar14) {
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"endsolid","");
      _Var15 = readMeshFromAsciiStlFile::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)&local_230,&local_250,prefix);
      bVar14 = !_Var15;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
    }
    else {
      bVar14 = false;
    }
    if (!bVar14) break;
    local_2c8._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"facet","");
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()(&local_288,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    local_2c8._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"normal","");
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()(&local_288,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    piVar16 = ::std::istream::_M_extract<double>((double *)local_1b8);
    piVar16 = ::std::istream::_M_extract<double>((double *)piVar16);
    ::std::istream::_M_extract<double>((double *)piVar16);
    local_260 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p;
    local_270 = local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_268 = local_290;
    readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()(&local_1e0);
    local_2c8._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"outer","");
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()(&local_288,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    local_2c8._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"loop","");
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()(&local_288,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (unsigned_long *)0x0;
    local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    while( true ) {
      bVar14 = readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()(&local_1e0);
      if (bVar14) {
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"endloop","");
        _Var15 = readMeshFromAsciiStlFile::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)&local_230,&local_200,prefix_00);
        bVar14 = !_Var15;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p);
        }
      }
      else {
        bVar14 = false;
      }
      if (!bVar14) break;
      local_2c8._M_dataplus._M_p = (pointer)paVar2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"vertex","");
      readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()(&local_288,&local_2c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != paVar2) {
        operator_delete(local_2c8._M_dataplus._M_p);
      }
      piVar16 = ::std::istream::_M_extract<double>((double *)local_1b8);
      piVar16 = ::std::istream::_M_extract<double>((double *)piVar16);
      ::std::istream::_M_extract<double>((double *)piVar16);
      local_2c8._M_dataplus._M_p = (pointer)local_290;
      local_2c8._M_string_length = (size_type)local_208;
      local_2c8.field_2._M_allocated_capacity = (size_type)local_210;
      __position._M_current =
           (this->vertexCoordinates).
           super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->vertexCoordinates).
          super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<geometrycentral::Vector3,std::allocator<geometrycentral::Vector3>>::
        _M_realloc_insert<geometrycentral::Vector3_const&>
                  (local_258,__position,(Vector3 *)&local_2c8);
      }
      else {
        (__position._M_current)->z = local_210;
        (__position._M_current)->x = (double)local_290;
        (__position._M_current)->y = local_208;
        ppVVar1 = &(this->vertexCoordinates).
                   super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppVVar1 = *ppVVar1 + 1;
      }
      local_290 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(((long)(this->vertexCoordinates).
                             super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->vertexCoordinates).
                             super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                     -1);
      if (local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
        _M_realloc_insert<unsigned_long>
                  (&local_2a8,
                   (iterator)
                   local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_290);
      }
      else {
        *local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = (unsigned_long)local_290;
        local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    readMeshFromAsciiStlFile::anon_class_32_4_26ba02a2::operator()(&local_1e0);
    local_2c8._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"endfacet","");
    readMeshFromAsciiStlFile::anon_class_24_3_19152d57::operator()(&local_288,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != paVar2) {
      operator_delete(local_2c8._M_dataplus._M_p);
    }
    uVar3 = *local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[1];
    pVVar5 = (this->vertexCoordinates).
             super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar7 = pVVar5[uVar4].x - pVVar5[uVar3].x;
    dVar8 = pVVar5[uVar4].y - pVVar5[uVar3].y;
    uVar6 = local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[2];
    dVar9 = pVVar5[uVar4].z - pVVar5[uVar3].z;
    dVar10 = pVVar5[uVar6].x - pVVar5[uVar3].x;
    dVar11 = pVVar5[uVar6].y - pVVar5[uVar3].y;
    dVar12 = pVVar5[uVar6].z - pVVar5[uVar3].z;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar8;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar12;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = dVar11 * dVar9;
    auVar20 = vfmsub231sd_fma(auVar30,auVar20,auVar27);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar10;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar9;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar12 * dVar7;
    auVar19 = vfmsub231sd_fma(auVar28,auVar22,auVar25);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_260;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = auVar19._0_8_ * (double)local_270;
    auVar20 = vfmadd213sd_fma(auVar29,auVar20,auVar26);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar7;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar10 * dVar8;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar11;
    auVar19 = vfmsub231sd_fma(auVar21,auVar19,auVar24);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_268;
    auVar20 = vfmadd213sd_fma(auVar23,auVar19,auVar20);
    if ((auVar20._0_8_ < 0.0) &&
       (puVar18 = local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish + -1,
       puVar13 = local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start,
       local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start < puVar18 &&
       local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start !=
       local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish)) {
      do {
        puVar17 = puVar13 + 1;
        uVar3 = *puVar13;
        *puVar13 = *puVar18;
        *puVar18 = uVar3;
        puVar18 = puVar18 + -1;
        puVar13 = puVar17;
      } while (puVar17 < puVar18);
    }
    ::std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)this,&local_2a8);
    if (local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
      operator_delete(local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SimplePolygonMesh::readMeshFromAsciiStlFile(std::istream& in) {
  clear();

  std::string line;
  std::stringstream ss;
  size_t lineNum = 1;

  auto assertToken = [&](const std::string& expected) {
    std::string token;
    ss >> token;
    if (token != expected) {
      std::ostringstream errorMessage;
      errorMessage << "Failed to parse ASCII stl file." << std::endl
                   << "Error on line " << lineNum << ". Expected \"" << expected << "\" but token \"" << token << "\""
                   << std::endl
                   << "Full line: \"" << line << "\"" << std::endl;
      throw std::runtime_error(errorMessage.str());
    }
  };

  auto nextLine = [&]() {
    if (!getline(in, line)) {
      return false;
    }

    ss = std::stringstream(line);
    lineNum++;
    return true;
  };

  auto startsWithToken = [](const std::string& str, const std::string& prefix) {
    std::stringstream ss(str);
    std::string token;
    ss >> token;
    return token == prefix;
  };
  // Eat the header line
  nextLine();  
  // Parse STL file
  while (nextLine() && !startsWithToken(line, "endsolid")) {
    assertToken("facet");
    assertToken("normal");

    // TODO: store this normal?
    Vector3 normal;
    ss >> normal;

    nextLine();

    assertToken("outer");
    assertToken("loop");

    std::vector<size_t> face;
    while (nextLine() && !startsWithToken(line, "endloop")) {
      assertToken("vertex");

      Vector3 position;
      ss >> position;
      vertexCoordinates.push_back(position);

      face.push_back(vertexCoordinates.size() - 1);
    }

    nextLine();
    assertToken("endfacet");

    // Orient face using normal
    Vector3 faceNormal = cross(vertexCoordinates[face[1]] - vertexCoordinates[face[0]],
                               vertexCoordinates[face[2]] - vertexCoordinates[face[0]]);
    if (dot(faceNormal, normal) < 0) {
      std::reverse(std::begin(face), std::end(face));
    }

    polygons.push_back(face);
  }
}